

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# btree_test.cc
# Opt level: O0

void __thiscall
phmap::priv::anon_unknown_0::Btree_UpperBoundRegression_Test::~Btree_UpperBoundRegression_Test
          (Btree_UpperBoundRegression_Test *this)

{
  Btree_UpperBoundRegression_Test *this_local;
  
  ~Btree_UpperBoundRegression_Test(this);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(Btree, UpperBoundRegression) {
        // Regress a bug where upper_bound would default-construct a new key_compare
        // instead of copying the existing one.
        using SubstringSet = phmap::btree_set<std::string, SubstringLess>;
        SubstringSet my_set(SubstringLess(3));
        my_set.insert("aab");
        my_set.insert("abb");
        // We call upper_bound("aaa").  If this correctly uses the length 3
        // comparator, aaa < aab < abb, so we should get aab as the result.
        // If it instead uses the default-constructed length 2 comparator,
        // aa == aa < ab, so we'll get abb as our result.
        SubstringSet::iterator it = my_set.upper_bound("aaa");
        ASSERT_TRUE(it != my_set.end());
        EXPECT_EQ("aab", *it);
    }